

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

inform_dist * inform_dist_approximate(double *probs,size_t n,double tol)

{
  ulong uVar1;
  ulong uVar2;
  size_t i;
  size_t sVar3;
  uint32_t *data;
  inform_dist *piVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  
  if (n != 0 && probs != (double *)0x0) {
    dVar8 = 1.0;
    sVar3 = 0;
    do {
      if (probs[sVar3] < 0.0) {
        return (inform_dist *)0x0;
      }
      dVar8 = dVar8 - probs[sVar3];
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
    auVar7._8_4_ = (int)(n >> 0x20);
    auVar7._0_8_ = n;
    auVar7._12_4_ = 0x45300000;
    if ((ABS(dVar8) <=
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * ABS(tol)) &&
       (data = (uint32_t *)malloc(n * 4), data != (uint32_t *)0x0)) {
      sVar3 = 0;
      do {
        data[sVar3] = (uint32_t)(long)(probs[sVar3] / ABS(tol));
        sVar3 = sVar3 + 1;
      } while (n != sVar3);
      uVar5 = *data;
      if (n < 2) {
        uVar6 = (ulong)uVar5;
      }
      else {
        sVar3 = 1;
        do {
          uVar2 = (ulong)data[sVar3];
          if (data[sVar3] == 0) {
            uVar6 = (ulong)uVar5;
          }
          else {
            do {
              uVar6 = uVar2;
              uVar1 = (ulong)uVar5;
              uVar5 = (uint)uVar6;
              uVar2 = uVar1 % uVar6;
            } while ((int)(uVar1 % uVar6) != 0);
          }
          sVar3 = sVar3 + 1;
          uVar5 = (uint)uVar6;
        } while (sVar3 != n);
      }
      sVar3 = 0;
      do {
        data[sVar3] = (uint32_t)(data[sVar3] / uVar6);
        sVar3 = sVar3 + 1;
      } while (n != sVar3);
      piVar4 = inform_dist_create(data,n);
      free(data);
      return piVar4;
    }
  }
  return (inform_dist *)0x0;
}

Assistant:

inform_dist* inform_dist_approximate(double const *probs, size_t n, double tol)
{
    if (probs == NULL || n == 0)
    {
        return NULL;
    }
    tol = fabs(tol);
    // check the validity of the probability distribution
    double diff = 1.0;
    for (size_t i = 0; i < n; ++i)
    {
        diff -= probs[i];
        if (probs[i] < 0.0) return NULL;
    }
    if (fabs(diff) > (double)n * tol)
    {
        return NULL;
    }
    // determine the number of counts
    uint32_t *counts = malloc(n * sizeof(int));
    if (counts == NULL)
    {
        return NULL;
    }
    for (size_t i = 0; i < n; ++i)
    {
        counts[i] = (uint32_t)(probs[i] / tol);
    }
    int g = gcd(counts, n);
    for (size_t i = 0; i < n; ++i)
    {
        counts[i] /= g;
    }
    // create the distribution
    inform_dist *dist = inform_dist_create(counts, n);
    free(counts);
    return dist;
}